

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apx_connection.c
# Opt level: O0

apx_connection_t * apx_connection_new(void)

{
  apx_error_t aVar1;
  apx_connection_t *paStack_10;
  apx_error_t rc;
  apx_connection_t *self;
  
  paStack_10 = (apx_connection_t *)malloc(0x80);
  if ((paStack_10 != (apx_connection_t *)0x0) &&
     (aVar1 = apx_connection_create(paStack_10), aVar1 != 0)) {
    free(paStack_10);
    paStack_10 = (apx_connection_t *)0x0;
  }
  return paStack_10;
}

Assistant:

apx_connection_t *apx_connection_new(void)
{
   apx_connection_t *self = (apx_connection_t*) malloc(sizeof(apx_connection_t));
   if (self != 0)
   {
      apx_error_t rc = apx_connection_create(self);
      if (rc != APX_NO_ERROR)
      {
         free(self);
         self = (apx_connection_t*) 0;
      }
   }
   return self;
}